

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ReflectionSchema *this_00;
  ulong uVar1;
  bool bVar2;
  CppType CVar3;
  uint32_t uVar4;
  int iVar5;
  MessageLite *pMVar6;
  Message **ppMVar7;
  Message *pMVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  OneofDescriptor *oneof_descriptor;
  undefined8 *puVar9;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  this_00 = &this->schema_;
  if (((byte)field[1] & 8) != 0) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    pMVar6 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field
                        ,factory);
    return (Message *)pMVar6;
  }
  uVar4 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    bVar2 = HasOneofField(this,message,field);
    if (!bVar2) {
      if (((byte)field[1] & 0x10) == 0) {
        oneof_descriptor = (OneofDescriptor *)0x0;
      }
      else {
        oneof_descriptor = *(OneofDescriptor **)(field + 0x28);
      }
      ClearOneof(this,message,oneof_descriptor);
      ppMVar7 = MutableField<google::protobuf::Message*>(this,message,field);
      pMVar8 = GetDefaultMessageInstance(this,field);
      uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
      puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        puVar9 = (undefined8 *)*puVar9;
      }
      iVar5 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[3])(pMVar8,puVar9);
      pMVar8 = (Message *)CONCAT44(extraout_var,iVar5);
      *ppMVar7 = pMVar8;
      goto LAB_00396a68;
    }
  }
  else {
    SetBit(this,message,field);
  }
  ppMVar7 = (Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  pMVar8 = *ppMVar7;
LAB_00396a68:
  if (pMVar8 == (Message *)0x0) {
    pMVar8 = GetDefaultMessageInstance(this,field);
    uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
    puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar9 = (undefined8 *)*puVar9;
    }
    iVar5 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[3])(pMVar8,puVar9);
    pMVar8 = (Message *)CONCAT44(extraout_var_00,iVar5);
    *ppMVar7 = pMVar8;
  }
  return pMVar8;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = GetDefaultMessageInstance(field);
        *result_holder = default_message->New(message->GetArenaForAllocation());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = GetDefaultMessageInstance(field);
      *result_holder = default_message->New(message->GetArenaForAllocation());
    }
    result = *result_holder;
    return result;
  }
}